

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

void updateRoutingTableForNeighbor(routerip_t *neighbor,routingtable_t *neighborRouter)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  size_t sVar3;
  _Base_ptr p_Var4;
  int iVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  pointer pLVar9;
  pointer pLVar10;
  pointer pLVar11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_color _Var13;
  bool bVar14;
  bool bVar15;
  allocator<char> local_b1;
  _Rb_tree_node_base *local_b0;
  _Rb_tree_node_base *local_a8;
  routingtable_t *local_a0;
  pointer local_98;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  long *local_70;
  _Base_ptr local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  p_Var8 = routingMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = neighborRouter;
  if ((_Rb_tree_header *)routingMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      != &routingMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    do {
      p_Var12 = p_Var8 + 1;
      pcVar6 = inet_ntoa((in_addr)socketLocal.socketAddr.sin_addr.s_addr);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar6,&local_b1);
      p_Var2 = p_Var8[1]._M_parent;
      if (p_Var2 == local_68) {
        if (p_Var2 == (_Base_ptr)0x0) {
          bVar14 = true;
        }
        else {
          iVar5 = bcmp(*(void **)p_Var12,local_70,(size_t)p_Var2);
          bVar14 = iVar5 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if ((!bVar14) &&
         (links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
          _M_finish)) {
        local_a8 = p_Var8 + 3;
        local_98 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        pLVar11 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pLVar10 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_b0 = p_Var12;
        do {
          pLVar9 = pLVar10 + 1;
          sVar3 = neighbor->_M_string_length;
          if ((sVar3 == (pLVar10->neighbor)._M_string_length) &&
             ((sVar3 == 0 ||
              (iVar5 = bcmp((neighbor->_M_dataplus)._M_p,(pLVar10->neighbor)._M_dataplus._M_p,sVar3)
              , iVar5 == 0)))) {
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                     ::operator[](&routingMap_abi_cxx11_,(key_type *)p_Var12);
            sVar3 = neighbor->_M_string_length;
            if (sVar3 == (pmVar7->nextHop)._M_string_length) {
              if (sVar3 == 0) {
                bVar14 = true;
              }
              else {
                iVar5 = bcmp((neighbor->_M_dataplus)._M_p,(pmVar7->nextHop)._M_dataplus._M_p,sVar3);
                bVar14 = iVar5 == 0;
              }
            }
            else {
              bVar14 = false;
            }
            if (bVar14) {
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                       ::operator[](local_a0,(key_type *)p_Var12);
              pcVar6 = inet_ntoa((in_addr)socketLocal.socketAddr.sin_addr.s_addr);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,pcVar6,(allocator<char> *)&local_70);
              sVar3 = (pmVar7->nextHop)._M_string_length;
              p_Var12 = local_b0;
              if (sVar3 == local_48) {
                if (sVar3 == 0) {
                  bVar15 = true;
                }
                else {
                  iVar5 = bcmp((pmVar7->nextHop)._M_dataplus._M_p,local_50,sVar3);
                  bVar15 = iVar5 == 0;
                  p_Var12 = local_b0;
                }
              }
              else {
                bVar15 = false;
              }
            }
            else {
              bVar15 = false;
            }
            if ((bVar14) && (local_50 != local_40)) {
              operator_delete(local_50,local_40[0] + 1);
            }
            if (bVar15) {
              std::__cxx11::string::_M_replace
                        ((ulong)local_a8,0,(char *)p_Var8[3]._M_parent,0x10a03b);
              p_Var8[4]._M_color = 0x7fffffff;
              bVar15 = true;
              pLVar11 = local_98;
            }
            else {
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                       ::operator[](local_a0,(key_type *)p_Var12);
              pLVar11 = local_98;
              _Var13 = 0x7fffffff;
              if (pmVar7->cost != 0x7fffffff) {
                iVar5 = pLVar10->cost;
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                         ::operator[](local_a0,(key_type *)p_Var12);
                _Var13 = iVar5 + pmVar7->cost;
              }
              p_Var2 = (_Base_ptr)neighbor->_M_string_length;
              p_Var4 = p_Var8[3]._M_parent;
              if ((p_Var2 == p_Var4) &&
                 (((p_Var2 == (_Base_ptr)0x0 ||
                   (iVar5 = bcmp((neighbor->_M_dataplus)._M_p,*(void **)local_a8,(size_t)p_Var2),
                   iVar5 == 0)) && (p_Var8[4]._M_color != _Var13)))) {
                p_Var8[4]._M_color = _Var13;
                if (_Var13 == 0x7fffffff) {
                  std::__cxx11::string::_M_replace((ulong)local_a8,0,(char *)p_Var4,0x10a03b);
                  p_Var8[4]._M_color = 0x7fffffff;
                }
LAB_00104990:
                tableUpdated = true;
                bVar15 = true;
                bVar14 = false;
                p_Var12 = local_b0;
              }
              else {
                _Var1 = p_Var8[4]._M_color;
                if ((int)_Var13 < (int)_Var1) {
                  pcVar6 = inet_ntoa((in_addr)socketLocal.socketAddr.sin_addr.s_addr);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_90,pcVar6,(allocator<char> *)&local_70);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                           ::operator[](local_a0,(key_type *)local_b0);
                  bVar14 = true;
                  if (local_88 == (pmVar7->nextHop)._M_string_length) {
                    if (local_88 == 0) goto LAB_0010494a;
                    iVar5 = bcmp(local_90,(pmVar7->nextHop)._M_dataplus._M_p,local_88);
                    bVar14 = iVar5 != 0;
                  }
                }
                else {
LAB_0010494a:
                  bVar14 = false;
                }
                p_Var12 = local_b0;
                if (((int)_Var13 < (int)_Var1) && (local_90 != local_80)) {
                  operator_delete(local_90,local_80[0] + 1);
                }
                if (bVar14) {
                  std::__cxx11::string::_M_assign((string *)local_a8);
                  p_Var8[4]._M_color = _Var13;
                  pLVar11 = local_98;
                  goto LAB_00104990;
                }
                bVar15 = false;
                bVar14 = true;
                pLVar11 = local_98;
              }
              if (bVar14) goto LAB_001049b2;
            }
          }
          else {
LAB_001049b2:
            bVar15 = false;
          }
        } while ((!bVar15) && (pLVar10 = pLVar9, pLVar9 != pLVar11));
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &routingMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
    ;
  }
  return;
}

Assistant:

void updateRoutingTableForNeighbor(const routerip_t &neighbor, routingtable_t &neighborRouter) {
	for (auto &[destination, destEntry]:routingMap) {
		if (destination == socketLocal.getLocalIP()) continue;
		for (const auto &link:links) {
			if (neighbor == link.neighbor) {

				if(neighbor == routingMap[destination].nextHop && neighborRouter[destination].nextHop == socketLocal.getLocalIP()){
					// circular
					destEntry.nextHop = NONE;
					destEntry.cost = INF;
					break;
				}

				cost_t cost_via_neighbor =
						neighborRouter[destination].cost == INF ? INF : (link.cost + neighborRouter[destination].cost);
				if (neighbor == destEntry.nextHop && destEntry.cost != cost_via_neighbor) {
					// cost changed @ nextHop & neighbor is the way to reach into destination
					destEntry.cost = cost_via_neighbor;
					// || socketLocal.getLocalIP() == neighborRouter[destination].nextHop
					if (cost_via_neighbor == INF) {
						// 2nd condtn prevents circular updates for initial deactivated links
						destEntry.nextHop = NONE;
						destEntry.cost = INF;
					}
					tableUpdated = true;
					break;
				} else if (cost_via_neighbor < destEntry.cost &&
				           socketLocal.getLocalIP() != neighborRouter[destination].nextHop) {
					// take less cost not creating loop
					destEntry.nextHop = neighbor;
					destEntry.cost = cost_via_neighbor;
					tableUpdated = true;
					break;
				}
			}
		}
	}
	printUpdate();
}